

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

UniquePtr<SDL_Texture> * __thiscall
solitaire::graphics::SDLGraphicsSystemWithCreatedWindowTests::makeSDLTexture
          (UniquePtr<SDL_Texture> *__return_storage_ptr__,
          SDLGraphicsSystemWithCreatedWindowTests *this,SDL_Texture_conflict *ptr)

{
  shared_ptr<solitaire::SDL::PtrDeleterMock> local_60;
  PtrDeleter local_50;
  function<void_(SDL_Texture_*)> local_40;
  SDL_Texture_conflict *local_20;
  SDL_Texture_conflict *ptr_local;
  SDLGraphicsSystemWithCreatedWindowTests *this_local;
  
  local_20 = ptr;
  ptr_local = (SDL_Texture_conflict *)this;
  this_local = (SDLGraphicsSystemWithCreatedWindowTests *)__return_storage_ptr__;
  std::shared_ptr<solitaire::SDL::PtrDeleterMock>::
  shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,void>
            (&local_60,&(this->super_SDLGraphicsSystemTests).ptrDeleterMock);
  SDL::PtrDeleter::PtrDeleter(&local_50,&local_60);
  std::function<void(SDL_Texture*)>::function<solitaire::SDL::PtrDeleter,void>
            ((function<void(SDL_Texture*)> *)&local_40,&local_50);
  std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>::
  unique_ptr<std::function<void(SDL_Texture*)>,void>
            ((unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>> *)__return_storage_ptr__,ptr
             ,&local_40);
  std::function<void_(SDL_Texture_*)>::~function(&local_40);
  SDL::PtrDeleter::~PtrDeleter(&local_50);
  std::shared_ptr<solitaire::SDL::PtrDeleterMock>::~shared_ptr(&local_60);
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Texture> makeSDLTexture(SDL_Texture* ptr) {
        return UniquePtr<SDL_Texture> {ptr, PtrDeleter {ptrDeleterMock}};
    }